

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_subx_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ret;
  int opsize;
  int arg2;
  TCGv_i32 pTVar1;
  TCGv_i32 dest;
  undefined6 in_register_00000012;
  TCGv_i32 *ppTVar2;
  uint uVar3;
  uintptr_t o;
  TCGv_i32 *ppTVar4;
  uintptr_t o_1;
  
  uVar3 = (uint)CONCAT62(in_register_00000012,insn);
  tcg_ctx = s->uc->tcg_ctx;
  opsize = insn_opsize(uVar3);
  ppTVar4 = s->writeback;
  ppTVar2 = tcg_ctx->cpu_aregs;
  if (((uint)s->writeback_mask >> (uVar3 & 7) & 1) != 0) {
    ppTVar2 = ppTVar4;
  }
  pTVar1 = ppTVar2[uVar3 & 7];
  arg2 = opsize_bytes(opsize);
  tcg_gen_subi_i32_m68k(tcg_ctx,pTVar1,pTVar1,arg2);
  pTVar1 = gen_load(s,opsize,pTVar1,1,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  uVar3 = uVar3 >> 9 & 7;
  if (((uint)s->writeback_mask >> uVar3 & 1) == 0) {
    ppTVar4 = s->uc->tcg_ctx->cpu_aregs;
  }
  ret = ppTVar4[uVar3];
  tcg_gen_subi_i32_m68k(tcg_ctx,ret,ret,arg2);
  dest = gen_load(s,opsize,ret,1,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  gen_subx(s,pTVar1,dest,opsize);
  gen_store(s,opsize,ret,QREG_CC_N,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(dest + (long)tcg_ctx));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

DISAS_INSN(subx_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv addr_src;
    TCGv dest;
    TCGv addr_dest;
    int opsize;

    opsize = insn_opsize(insn);

    addr_src = AREG(insn, 0);
    tcg_gen_subi_i32(tcg_ctx, addr_src, addr_src, opsize_bytes(opsize));
    src = gen_load(s, opsize, addr_src, 1, IS_USER(s));

    addr_dest = AREG(insn, 9);
    tcg_gen_subi_i32(tcg_ctx, addr_dest, addr_dest, opsize_bytes(opsize));
    dest = gen_load(s, opsize, addr_dest, 1, IS_USER(s));

    gen_subx(s, src, dest, opsize);

    gen_store(s, opsize, addr_dest, QREG_CC_N, IS_USER(s));

    tcg_temp_free(tcg_ctx, dest);
    tcg_temp_free(tcg_ctx, src);
}